

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_uri.c
# Opt level: O1

ares_status_t ares_uri_set_scheme(ares_uri_t *uri,char *scheme)

{
  byte bVar1;
  size_t sVar2;
  byte *pbVar3;
  
  if (uri == (ares_uri_t *)0x0) {
    return ARES_EFORMERR;
  }
  sVar2 = ares_strlen(scheme);
  if ((sVar2 == 0) || (pbVar3 = (byte *)scheme, 0x19 < (byte)((*scheme & 0xdfU) + 0xbf))) {
    return ARES_EBADSTR;
  }
  do {
    bVar1 = *pbVar3;
    if ((1 < bVar1 - 0x2d) && (bVar1 != 0x2b)) {
      if (bVar1 == 0) {
        ares_strcpy(uri->scheme,scheme,0x10);
        ares_str_lower(uri->scheme);
        return ARES_SUCCESS;
      }
      if (((byte)(bVar1 - 0x3a) < 0xf6) && ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6)) {
        return ARES_EBADSTR;
      }
    }
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

ares_status_t ares_uri_set_scheme(ares_uri_t *uri, const char *scheme)
{
  if (uri == NULL) {
    return ARES_EFORMERR;
  }

  if (!ares_uri_scheme_is_valid(scheme)) {
    return ARES_EBADSTR;
  }

  ares_strcpy(uri->scheme, scheme, sizeof(uri->scheme));
  ares_str_lower(uri->scheme);

  return ARES_SUCCESS;
}